

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# to_interval.cpp
# Opt level: O2

interval_t duckdb::ToWeeksOperator::Operation<long,duckdb::interval_t>(long input)

{
  bool bVar1;
  int left;
  OutOfRangeException *this;
  interval_t iVar2;
  allocator local_49;
  undefined4 local_48;
  int32_t aiStack_44 [3];
  string local_38;
  
  left = Cast::Operation<long,int>(input);
  local_48 = 0;
  bVar1 = TryMultiplyOperator::Operation<int,int,int>(left,7,aiStack_44);
  if (bVar1) {
    iVar2.days = aiStack_44[0];
    iVar2.months = local_48;
    iVar2.micros = 0;
    return iVar2;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_38,"Interval value %d weeks out of range",&local_49);
  OutOfRangeException::OutOfRangeException<long>(this,&local_38,input);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input) {
		const auto iinput = Cast::Operation<TA, int32_t>(input);
		interval_t result;
		result.months = 0;
		if (!TryMultiplyOperator::Operation<int32_t, int32_t, int32_t>(iinput, Interval::DAYS_PER_WEEK, result.days)) {
			throw OutOfRangeException("Interval value %d weeks out of range", input);
		}
		result.micros = 0;
		return result;
	}